

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any.hpp
# Opt level: O0

big_type * linb::any_cast<big_type>(big_type *__return_storage_ptr__,any *operand)

{
  big_type *pbVar1;
  bad_any_cast *this;
  big_type *p;
  any *operand_local;
  
  pbVar1 = any_cast<big_type>(operand);
  if (pbVar1 == (big_type *)0x0) {
    this = (bad_any_cast *)__cxa_allocate_exception(8);
    memset(this,0,8);
    bad_any_cast::bad_any_cast(this);
    __cxa_throw(this,&bad_any_cast::typeinfo,bad_any_cast::~bad_any_cast);
  }
  detail::any_cast_move_if_true<big_type>(__return_storage_ptr__,pbVar1);
  return __return_storage_ptr__;
}

Assistant:

inline ValueType any_cast(any&& operand)
{
    using can_move = std::integral_constant<bool,
        std::is_move_constructible<ValueType>::value
        && !std::is_lvalue_reference<ValueType>::value>;

    auto p = any_cast<typename std::remove_reference<ValueType>::type>(&operand);
#ifndef ANY_IMPL_NO_EXCEPTIONS
    if(p == nullptr) throw bad_any_cast();
#endif
    return detail::any_cast_move_if_true<ValueType>(p, can_move());
}